

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_transpose(ggml_context *ctx,ggml_tensor *a)

{
  int *piVar1;
  undefined4 extraout_EAX;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *extraout_RAX;
  ggml_tensor *in_RCX;
  int32_t value;
  int extraout_EDX;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *extraout_RDX_03;
  ggml_tensor *unaff_RBX;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *unaff_R14;
  int iStack_d8;
  int iStack_d4;
  undefined8 uStack_d0;
  ggml_tensor *pgStack_c0;
  ggml_tensor *pgStack_b8;
  ggml_type gStack_b0;
  int iStack_ac;
  undefined8 uStack_a8;
  ggml_tensor *pgStack_98;
  ggml_tensor *pgStack_90;
  undefined4 uStack_88;
  int aiStack_84 [3];
  ggml_type gStack_20;
  int iStack_1c;
  
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar2->ne[0] = a->ne[1];
    pgVar2->ne[1] = a->ne[0];
    pgVar2->nb[0] = a->nb[1];
    pgVar2->nb[1] = a->nb[0];
    pgVar2->op = GGML_OP_TRANSPOSE;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = a;
    pgVar2->src1 = (ggml_tensor *)0x0;
    return pgVar2;
  }
  ggml_transpose_cold_1();
  if ((((a->ne[2] == 1) && (unaff_R14 = a, a->ne[3] == 1)) &&
      (unaff_RBX = extraout_RDX, extraout_RDX->ne[1] == 1)) &&
     (((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)) &&
      (extraout_RDX->type == GGML_TYPE_I32)))) {
    if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
      _gStack_20 = CONCAT44(extraout_RDX->ne[0],a->ne[0]);
      pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_20,(void *)0x0);
      pgVar2->op = GGML_OP_GET_ROWS;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = extraout_RDX;
      return pgVar2;
    }
  }
  else {
    ggml_get_rows_cold_1();
  }
  ggml_get_rows_cold_2();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar3 = ggml_new_i32(ctx,value);
    pgVar2->op = GGML_OP_DIAG_MASK_INF;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = a;
    pgVar2->src1 = pgVar3;
    return pgVar2;
  }
  ggml_diag_mask_inf_cold_1();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar2->op = GGML_OP_SOFT_MAX;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = a;
    pgVar2->src1 = (ggml_tensor *)0x0;
    return pgVar2;
  }
  ggml_soft_max_cold_1();
  if (extraout_EDX < 0) {
    pgStack_90 = (ggml_tensor *)0x12611e;
    ggml_rope_cold_1();
  }
  else {
    unaff_RBX = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgStack_90 = (ggml_tensor *)0x1260bb;
      uStack_88 = extraout_EAX;
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      _uStack_88 = CONCAT44(3,uStack_88);
      pgStack_90 = (ggml_tensor *)0x1260de;
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,aiStack_84,(void *)0x0);
      piVar1 = (int *)pgVar3->data;
      *piVar1 = extraout_EDX;
      piVar1[1] = (int)in_RCX;
      piVar1[2] = (int)in_R8;
      pgVar2->op = GGML_OP_ROPE;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = pgVar3;
      return pgVar2;
    }
  }
  pgStack_90 = (ggml_tensor *)ggml_conv_1d_1s;
  ggml_rope_cold_2();
  pgVar2 = unaff_RBX;
  pgStack_98 = unaff_RBX;
  pgStack_90 = unaff_R14;
  if ((extraout_RDX_00->ne[2] == 1) && (pgVar2 = extraout_RDX_00, extraout_RDX_00->ne[3] == 1)) {
    pgVar3 = a;
    if (a->ne[1] != extraout_RDX_00->ne[1]) goto LAB_001261b1;
    if (a->ne[3] == 1) {
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        gStack_b0 = extraout_RDX_00->ne[0];
        iStack_ac = a->ne[2];
        uStack_a8 = 0x100000001;
        pgStack_b8 = (ggml_tensor *)0x126188;
        pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_b0,(void *)0x0);
        pgVar2->op = GGML_OP_CONV_1D_1S;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX_00;
        return pgVar2;
      }
      goto LAB_001261ac;
    }
  }
  else {
    pgStack_b8 = (ggml_tensor *)0x1261ac;
    ggml_conv_1d_1s_cold_1();
    pgVar3 = unaff_R14;
LAB_001261ac:
    pgStack_b8 = (ggml_tensor *)0x1261b1;
    ggml_conv_1d_1s_cold_4();
LAB_001261b1:
    pgStack_b8 = (ggml_tensor *)0x1261b6;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_b8 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_c0 = pgVar2;
  pgStack_b8 = pgVar3;
  if ((extraout_RDX_01->ne[2] == 1) && (extraout_RDX_01->ne[3] == 1)) {
    if (a->ne[1] == extraout_RDX_01->ne[1]) {
      if (a->ne[3] != 1) goto LAB_0012625b;
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) {
        iStack_d8 = extraout_RDX_01->ne[0] / 2;
        iStack_d4 = a->ne[2];
        uStack_d0 = 0x100000001;
        pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_d8,(void *)0x0);
        pgVar2->op = GGML_OP_CONV_1D_2S;
        pgVar2->grad = (ggml_tensor *)0x0;
        pgVar2->src0 = a;
        pgVar2->src1 = extraout_RDX_01;
        return pgVar2;
      }
      goto LAB_00126251;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_00126251:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_0012625b:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_02->ne[0] == a->ne[0]) && (extraout_RDX_02->ne[2] == a->ne[2])) &&
     (extraout_RDX_02->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
       (in_RCX->grad == (ggml_tensor *)0x0)) {
      pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar2->op = GGML_OP_FLASH_ATTN;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = extraout_RDX_02;
      pgVar2->opt[0] = in_RCX;
      pgVar3 = ggml_new_i32(ctx,(uint)in_R8 & 0xff);
      pgVar2->opt[1] = pgVar3;
      return pgVar2;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_03->ne[0] == a->ne[0]) && (extraout_RDX_03->ne[2] == a->ne[2])) &&
     (extraout_RDX_03->ne[3] == a->ne[3])) {
    if ((((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_03->grad == (ggml_tensor *)0x0)) &&
        (in_RCX->grad == (ggml_tensor *)0x0)) &&
       ((in_R8->grad == (ggml_tensor *)0x0 && (in_R9->grad == (ggml_tensor *)0x0)))) {
      pgVar2 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar2->op = GGML_OP_FLASH_FF;
      pgVar2->grad = (ggml_tensor *)0x0;
      pgVar2->src0 = a;
      pgVar2->src1 = extraout_RDX_03;
      pgVar2->opt[0] = in_RCX;
      pgVar2->opt[1] = in_R8;
      pgVar2->opt[2] = in_R9;
      return pgVar2;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar2;
    return pgVar2;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_transpose(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    result->ne[0] = a->ne[1];
    result->ne[1] = a->ne[0];

    result->nb[0] = a->nb[1];
    result->nb[1] = a->nb[0];

    result->op   = GGML_OP_TRANSPOSE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}